

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsTTDGetPreviousSnapshotInterval
          (JsRuntimeHandle runtimeHandle,int64_t currentSnapStartTime,int64_t *previousSnapTime)

{
  bool bVar1;
  JsrtRuntime *this;
  ThreadContext *this_00;
  int64 iVar2;
  ThreadContext *threadContext;
  JsrtRuntime *runtime;
  int64_t *previousSnapTime_local;
  int64_t currentSnapStartTime_local;
  JsRuntimeHandle runtimeHandle_local;
  
  this = JsrtRuntime::FromHandle(runtimeHandle);
  this_00 = JsrtRuntime::GetThreadContext(this);
  bVar1 = ThreadContext::IsRuntimeInTTDMode(this_00);
  if (!bVar1) {
    TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
  }
  iVar2 = TTD::EventLog::GetPreviousSnapshotInterval(this_00->TTDLog,currentSnapStartTime);
  *previousSnapTime = iVar2;
  return JsNoError;
}

Assistant:

CHAKRA_API JsTTDGetPreviousSnapshotInterval(_In_ JsRuntimeHandle runtimeHandle, _In_ int64_t currentSnapStartTime, _Out_ int64_t* previousSnapTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext * threadContext = runtime->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    *previousSnapTime = threadContext->TTDLog->GetPreviousSnapshotInterval(currentSnapStartTime);

    return JsNoError;
#endif
}